

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O3

void __thiscall LogToCallbackRedirector::~LogToCallbackRedirector(LogToCallbackRedirector *this)

{
  ~LogToCallbackRedirector(this);
  Assimp::Intern::AllocateFromAssimpHeap::operator_delete(this);
  return;
}

Assistant:

~LogToCallbackRedirector()  {
#ifndef ASSIMP_BUILD_SINGLETHREADED
        std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
        // (HACK) Check whether the 'stream.user' pointer points to a
        // custom LogStream allocated by #aiGetPredefinedLogStream.
        // In this case, we need to delete it, too. Of course, this
        // might cause strange problems, but the chance is quite low.

        PredefLogStreamMap::iterator it = std::find(gPredefinedStreams.begin(),
            gPredefinedStreams.end(), (Assimp::LogStream*)stream.user);

        if (it != gPredefinedStreams.end()) {
            delete *it;
            gPredefinedStreams.erase(it);
        }
    }